

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_reset(tsd_t *tsd,arena_t *arena)

{
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_cache_elm_t *prVar1;
  malloc_mutex_t *mutex;
  pthread_mutex_t *ppVar2;
  uint64_t *puVar3;
  witness_t **ppwVar4;
  rtree_ctx_cache_elm_t *prVar5;
  ulong *puVar6;
  bin_t *bin;
  void *pvVar7;
  rtree_leaf_elm_t *prVar8;
  bin_t *pbVar9;
  bin_info_t *pbVar10;
  ulong uVar11;
  int iVar12;
  extent_t *peVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  rtree_ctx_cache_elm_t *prVar17;
  rtree_ctx_cache_elm_t *prVar18;
  mutex_prof_data_t *data_2;
  bool bVar19;
  mutex_prof_data_t *data;
  extent_hooks_t *local_48;
  rtree_ctx_cache_elm_t *local_40;
  malloc_mutex_t *local_38;
  
  mutex = &arena->large_mtx;
  ppVar2 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x40);
  iVar12 = pthread_mutex_trylock(ppVar2);
  if (iVar12 != 0) {
    malloc_mutex_lock_slow(mutex);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar3 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar3 = *puVar3 + 1;
  if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar4 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
  }
  peVar13 = (arena->large).qlh_first;
  local_38 = mutex;
  if (peVar13 != (extent_t *)0x0) {
    rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    local_40 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache;
    prVar5 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache + 1;
    do {
      pvVar7 = peVar13->e_addr;
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar2);
      uVar14 = (ulong)pvVar7 & 0xffffffffc0000000;
      uVar15 = (ulong)(((uint)((ulong)pvVar7 >> 0x1e) & 0xf) << 4);
      puVar6 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar15);
      uVar15 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar15);
      if (uVar15 != uVar14) {
        if (local_40->leafkey == uVar14) {
          prVar8 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                   [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar15;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar6[1];
          *puVar6 = uVar14;
          puVar6[1] = (ulong)prVar8;
        }
        else {
          if (prVar5->leafkey == uVar14) {
            uVar16 = 0;
            bVar19 = false;
            prVar18 = prVar5;
          }
          else {
            uVar11 = 1;
            prVar17 = prVar5;
            do {
              uVar16 = uVar11;
              bVar19 = 6 < uVar16;
              if (uVar16 == 7) goto LAB_00117acd;
              prVar18 = prVar17 + 1;
              prVar1 = prVar17 + 1;
              uVar11 = uVar16 + 1;
              prVar17 = prVar18;
            } while (prVar1->leafkey != uVar14);
            bVar19 = 6 < uVar16;
          }
          prVar8 = prVar18->leaf;
          prVar18->leafkey = local_40[uVar16].leafkey;
          prVar18->leaf = local_40[uVar16].leaf;
          local_40[uVar16].leafkey = uVar15;
          local_40[uVar16].leaf = (rtree_leaf_elm_t *)puVar6[1];
          *puVar6 = uVar14;
          puVar6[1] = (ulong)prVar8;
LAB_00117acd:
          if (bVar19) {
            rtree_leaf_elm_lookup_hard
                      ((tsdn_t *)tsd,&extents_rtree,rtree_ctx,(ulong)pvVar7 & 0xfffffffffffff000,
                       true,false);
          }
        }
      }
      large_dalloc((tsdn_t *)tsd,peVar13);
      iVar12 = pthread_mutex_trylock(ppVar2);
      if (iVar12 != 0) {
        malloc_mutex_lock_slow(local_38);
        (arena->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar3 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar3 = *puVar3 + 1;
      if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar4 = &(arena->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
      }
      peVar13 = (arena->large).qlh_first;
    } while (peVar13 != (extent_t *)0x0);
  }
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar2);
  local_40 = (rtree_ctx_cache_elm_t *)0x0;
  do {
    if (bin_infos[(long)local_40].n_shards != 0) {
      pbVar10 = bin_infos + (long)local_40;
      local_38 = (malloc_mutex_t *)0x0;
      do {
        pbVar9 = arena->bins[(long)local_40].bin_shards;
        bin = pbVar9 + (long)local_38;
        ppVar2 = (pthread_mutex_t *)((long)&pbVar9[(long)local_38].lock.field_0 + 0x40);
        iVar12 = pthread_mutex_trylock(ppVar2);
        if (iVar12 != 0) {
          malloc_mutex_lock_slow(&bin->lock);
          (bin->lock).field_0.field_0.locked.repr = true;
        }
        puVar3 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar3 = *puVar3 + 1;
        if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
          ppwVar4 = &(bin->lock).field_0.witness.link.qre_prev;
          *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
        }
        peVar13 = bin->slabcur;
        if (peVar13 != (extent_t *)0x0) {
          bin->slabcur = (extent_t *)0x0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar2);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_48 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_48,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar2);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&bin->lock);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar3 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar3 = *puVar3 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar4 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
          }
        }
        peVar13 = extent_heap_remove_first(&bin->slabs_nonfull);
        while (peVar13 != (extent_t *)0x0) {
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar2);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_48 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_48,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar2);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&bin->lock);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar3 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar3 = *puVar3 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar4 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
          }
          peVar13 = extent_heap_remove_first(&bin->slabs_nonfull);
        }
        while (peVar13 = (bin->slabs_full).qlh_first, peVar13 != (extent_t *)0x0) {
          arena_bin_slabs_full_remove(arena,bin,peVar13);
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar2);
          LOCK();
          (arena->nactive).repr = (arena->nactive).repr - ((peVar13->field_2).e_size_esn >> 0xc);
          UNLOCK();
          local_48 = (extent_hooks_t *)0x0;
          arena_extents_dirty_dalloc((tsdn_t *)tsd,arena,&local_48,peVar13);
          iVar12 = pthread_mutex_trylock(ppVar2);
          if (iVar12 != 0) {
            malloc_mutex_lock_slow(&bin->lock);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar3 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar3 = *puVar3 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar4 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
          }
        }
        (bin->stats).curregs = 0;
        (bin->stats).curslabs = 0;
        (bin->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar2);
        local_38 = (malloc_mutex_t *)((long)local_38 + 1);
      } while (local_38 < (ulong)pbVar10->n_shards);
    }
    local_40 = (rtree_ctx_cache_elm_t *)((long)local_40 + 1);
  } while (local_40 != (rtree_ctx_cache_elm_t *)0x24);
  (arena->nactive).repr = 0;
  return;
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (extent_t *extent = extent_list_first(&arena->large); extent !=
	    NULL; extent = extent_list_first(&arena->large)) {
		void *ptr = extent_base_get(extent);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		alloc_ctx_t alloc_ctx;
		rtree_ctx_t *rtree_ctx = tsd_rtree_ctx(tsd);
		rtree_szind_slab_read(tsd_tsdn(tsd), &extents_rtree, rtree_ctx,
		    (uintptr_t)ptr, true, &alloc_ctx.szind, &alloc_ctx.slab);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		large_dalloc(tsd_tsdn(tsd), extent);
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena,
			    &arena->bins[i].bin_shards[j]);
		}
	}

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);
}